

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QPolygonF * __thiscall QGraphicsItem::mapToScene(QGraphicsItem *this,QRectF *rect)

{
  bool bVar1;
  QGraphicsItemPrivate *pQVar2;
  QRectF *in_RDX;
  long in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  qreal dx;
  QGraphicsItemPrivate *in_stack_ffffffffffffff80;
  QRectF *this_00;
  QPolygonF local_40;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             (in_RSI + 8));
  bVar1 = QGraphicsItemPrivate::hasTranslateOnlySceneTransform(in_stack_ffffffffffffff80);
  if (bVar1) {
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RSI + 8));
    dx = QTransform::dx(&pQVar2->sceneTransform);
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RSI + 8));
    QTransform::dy(&pQVar2->sceneTransform);
    QRectF::translated(this_00,dx,(qreal)in_RDX);
    QPolygonF::QPolygonF((QPolygonF *)this_00,(QRectF *)local_28);
  }
  else {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )(in_RSI + 8));
    QPolygonF::QPolygonF(&local_40,in_RDX);
    QTransform::map((QPolygonF *)this_00);
    QPolygonF::~QPolygonF((QPolygonF *)0x981960);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QPolygonF *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF QGraphicsItem::mapToScene(const QRectF &rect) const
{
    if (d_ptr->hasTranslateOnlySceneTransform())
        return rect.translated(d_ptr->sceneTransform.dx(), d_ptr->sceneTransform.dy());
    return d_ptr->sceneTransform.map(rect);
}